

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O0

btVector3 ThreePlaneIntersection(btPlane *p0,btPlane *p1,btPlane *p2)

{
  btScalar *_x;
  btScalar *_y;
  btScalar *_z;
  undefined8 *in_RDX;
  btScalar *in_RSI;
  btScalar *in_RDI;
  btScalar bVar1;
  btVector3 bVar2;
  btVector3 potentialVertex;
  btScalar quotient;
  btVector3 n1n2;
  btVector3 n3n1;
  btVector3 n2n3;
  btVector3 N3;
  btVector3 N2;
  btVector3 N1;
  btVector3 result;
  btVector3 *v;
  btVector3 *in_stack_fffffffffffffef0;
  btVector3 *this;
  btVector3 local_d8;
  float local_bc;
  btScalar local_b8 [2];
  btScalar abStack_b0 [2];
  btVector3 local_a8;
  btScalar local_98 [2];
  btScalar abStack_90 [2];
  btVector3 local_88;
  btScalar local_78 [2];
  btScalar abStack_70 [2];
  btVector3 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  btVector3 local_48;
  btVector3 local_38;
  undefined8 *local_28;
  btScalar *local_20;
  btScalar *local_18;
  btVector3 local_10;
  
  local_38.m_floats._0_8_ = *(undefined8 *)in_RDI;
  local_38.m_floats._8_8_ = *(undefined8 *)(in_RDI + 2);
  local_48.m_floats._0_8_ = *(undefined8 *)in_RSI;
  local_48.m_floats._8_8_ = *(undefined8 *)(in_RSI + 2);
  local_58 = *in_RDX;
  uStack_50 = in_RDX[1];
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  btVector3::btVector3(&local_68);
  v = &local_48;
  bVar2 = btVector3::cross(in_stack_fffffffffffffef0,v);
  abStack_70 = bVar2.m_floats._8_8_;
  local_78 = bVar2.m_floats._0_8_;
  local_68.m_floats._0_8_ = local_78;
  local_68.m_floats._8_8_ = abStack_70;
  btVector3::btVector3(&local_88);
  this = &local_38;
  bVar2 = btVector3::cross(this,v);
  abStack_90 = bVar2.m_floats._8_8_;
  local_98 = bVar2.m_floats._0_8_;
  local_88.m_floats._0_8_ = local_98;
  local_88.m_floats._8_8_ = abStack_90;
  btVector3::btVector3(&local_a8);
  bVar2 = btVector3::cross(this,v);
  abStack_b0 = bVar2.m_floats._8_8_;
  local_b8 = bVar2.m_floats._0_8_;
  local_a8.m_floats._0_8_ = local_b8;
  local_a8.m_floats._8_8_ = abStack_b0;
  bVar1 = btVector3::dot(this,&local_68);
  local_bc = -1.0 / bVar1;
  btVector3::operator*=(&local_68,local_18 + 4);
  btVector3::operator*=(&local_88,local_20 + 4);
  btVector3::operator*=(&local_a8,(btScalar *)(local_28 + 2));
  local_d8.m_floats[0] = local_68.m_floats[0];
  local_d8.m_floats[1] = local_68.m_floats[1];
  local_d8.m_floats[2] = local_68.m_floats[2];
  local_d8.m_floats[3] = local_68.m_floats[3];
  btVector3::operator+=(&local_d8,&local_88);
  btVector3::operator+=(&local_d8,&local_a8);
  btVector3::operator*=(&local_d8,&local_bc);
  _x = btVector3::getX(&local_d8);
  _y = btVector3::getY(&local_d8);
  _z = btVector3::getZ(&local_d8);
  btVector3::btVector3(&local_10,_x,_y,_z);
  return (btVector3)local_10.m_floats;
}

Assistant:

btVector3  ThreePlaneIntersection(const btPlane &p0,const btPlane &p1, const btPlane &p2)
{
	btVector3 N1 = p0.normal;
	btVector3 N2 = p1.normal;
	btVector3 N3 = p2.normal;

	btVector3 n2n3; n2n3 = N2.cross(N3);
	btVector3 n3n1; n3n1 = N3.cross(N1);
	btVector3 n1n2; n1n2 = N1.cross(N2);

	btScalar quotient = (N1.dot(n2n3));

	btAssert(btFabs(quotient) > btScalar(0.000001));
	
	quotient = btScalar(-1.) / quotient;
	n2n3 *= p0.dist;
	n3n1 *= p1.dist;
	n1n2 *= p2.dist;
	btVector3 potentialVertex = n2n3;
	potentialVertex += n3n1;
	potentialVertex += n1n2;
	potentialVertex *= quotient;

	btVector3 result(potentialVertex.getX(),potentialVertex.getY(),potentialVertex.getZ());
	return result;

}